

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O3

void checkfile(char *inp,permonst *pm,boolean user_typed_name,boolean without_asking)

{
  nh_menuitem *pnVar1;
  ushort uVar2;
  uint uVar3;
  attack aVar4;
  bool bVar5;
  boolean bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  dlb *pdVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  attack *paVar15;
  byte bVar16;
  long lVar17;
  undefined8 uVar18;
  undefined7 in_register_00000011;
  long lVar19;
  char *text;
  char *text_00;
  char *text_01;
  char *text_02;
  char *text_03;
  undefined4 uVar20;
  undefined7 uVar21;
  long lVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  undefined8 uVar26;
  ulong uVar27;
  permonst *ppVar28;
  char *pcVar29;
  bool bVar30;
  menulist menu;
  int entry_count;
  long txt_offset;
  char buf_1 [256];
  long entry_offset;
  char buf [256];
  char size [256];
  char newstr [256];
  char adjbuf [256];
  char specialadj [256];
  char mnname [256];
  menulist local_9a0;
  uint local_98c;
  uint local_988;
  undefined4 local_984;
  dlb *local_980;
  int local_978;
  int local_974;
  char *local_970;
  permonst *local_968;
  long local_960;
  uint local_958;
  uint local_954;
  undefined4 local_950;
  undefined4 local_94c;
  char local_948 [8];
  undefined8 uStack_940;
  undefined2 local_938;
  long local_840;
  char local_838 [256];
  int local_738;
  ushort local_734;
  undefined8 local_638;
  int local_630;
  char local_628 [240];
  attack local_538 [64];
  char local_438 [256];
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  pdVar11 = dlb_fopen("data","r");
  if (pdVar11 == (dlb *)0x0) {
    pline("Cannot open data file!");
    return;
  }
  local_94c = (undefined4)CONCAT71(in_register_00000011,user_typed_name);
  if ((char)pm != '\0') {
    pline("Looking up \"%s\"...",inp);
  }
  strcpy((char *)&local_638,inp);
  lcase((char *)&local_638);
  bVar30 = local_630 != 0x20666f20;
  bVar5 = local_638 != 0x726f697265746e69;
  lVar17 = 0xc;
  if (bVar30 || bVar5) {
    lVar17 = 0;
  }
  if (*(char *)((long)&local_638 + lVar17) == 'a') {
    lVar19 = 1;
    lVar22 = 1;
    if (!bVar30 && !bVar5) {
      lVar22 = 0xd;
    }
    if (*(char *)((long)&local_638 + lVar22) != ' ') {
      if (!bVar30 && !bVar5) {
        lVar19 = 0xd;
      }
      if (*(char *)((long)&local_638 + lVar19) == 'n') {
        lVar19 = 2;
        if (!bVar30 && !bVar5) {
          lVar19 = 0xe;
        }
        if (*(char *)((long)&local_638 + lVar19) == ' ') {
          lVar19 = 0xf;
          lVar17 = 3;
          goto LAB_0020f3e8;
        }
      }
      goto LAB_0020f453;
    }
    lVar19 = 0xe;
    lVar17 = 2;
LAB_0020f3e8:
    if (!bVar30 && !bVar5) {
      lVar17 = lVar19;
    }
    pcVar13 = (char *)((long)&local_638 + lVar17);
  }
  else {
LAB_0020f453:
    iVar8 = strncmp((char *)((long)&local_638 + lVar17),"the ",4);
    pcVar13 = (char *)((long)&local_638 + 4);
    if (!bVar30 && !bVar5) {
      pcVar13 = local_628;
    }
    if (iVar8 != 0) {
      pcVar13 = (char *)((long)&local_638 + lVar17);
    }
  }
  local_984 = SUB84(pm,0);
  lVar17 = 5;
  iVar8 = strncmp(pcVar13,"tame ",5);
  if (iVar8 != 0) {
    iVar8 = strncmp(pcVar13,"peaceful ",9);
    lVar17 = (ulong)(iVar8 == 0) * 9;
  }
  pcVar12 = pcVar13 + lVar17;
  iVar8 = strncmp(pcVar12,"invisible ",10);
  pcVar13 = pcVar13 + lVar17 + 10;
  if (iVar8 != 0) {
    pcVar13 = pcVar12;
  }
  iVar9 = strncmp(pcVar13,"statue of ",10);
  if (iVar9 == 0) {
    lVar19 = 0x10;
    lVar17 = 6;
LAB_0020f53f:
    if (iVar8 == 0) {
      lVar17 = lVar19;
    }
    pcVar12[lVar17] = '\0';
  }
  else {
    iVar9 = strncmp(pcVar13,"figurine of ",0xc);
    if (iVar9 == 0) {
      lVar19 = 0x12;
      lVar17 = 8;
      goto LAB_0020f53f;
    }
  }
  uVar18 = CONCAT71((uint7)(uint3)((uint)iVar8 >> 8),1);
  uVar20 = (undefined4)uVar18;
  if (*pcVar13 != '\0') {
    pcVar12 = strstri(pcVar13," [seen");
    if ((pcVar12 != (char *)0x0) || (pcVar12 = strstri(pcVar13," and more"), pcVar12 != (char *)0x0)
       ) {
      *pcVar12 = '\0';
    }
    pcVar12 = strstri(pcVar13," named ");
    if (pcVar12 == (char *)0x0) {
      pcVar12 = strstri(pcVar13," called ");
      if (pcVar12 == (char *)0x0) {
        pcVar12 = strstri(pcVar13,", ");
      }
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = pcVar12 + 7;
    }
    if (pcVar13 < pcVar12) {
      *pcVar12 = '\0';
    }
    if (pcVar29 == (char *)0x0) {
      pcVar29 = makesingular(pcVar13);
    }
    else if ((char)local_984 != '\0') {
      lcase(pcVar29);
    }
    local_960 = 0;
    pcVar12 = dlb_fgets(local_838,0x100,pdVar11);
    if ((pcVar12 == (char *)0x0) ||
       (pcVar12 = dlb_fgets(local_838,0x100,pdVar11), pcVar12 == (char *)0x0)) {
      impossible("can\'t read \'data\' file");
      goto LAB_00210caa;
    }
    iVar8 = __isoc99_sscanf(local_838,"%8lx\n",&local_960);
    if ((0 < iVar8) && (0 < local_960)) {
      pcVar12 = dlb_fgets(local_838,0x100,pdVar11);
      if (local_838[0] != '.' && pcVar12 != (char *)0x0) {
        uVar26 = 0;
        local_980 = pdVar11;
        do {
          bVar6 = digit(local_838[0]);
          if (bVar6 == '\0') {
            uVar21 = (undefined7)((ulong)uVar18 >> 8);
            uVar18 = CONCAT71(uVar21,1);
            if ((char)uVar26 == '\0') {
              pcVar12 = strchr(local_838,10);
              cVar7 = local_838[0];
              if (pcVar12 == (char *)0x0) goto LAB_00210c92;
              *pcVar12 = '\0';
              bVar30 = local_838[0] == '~';
              bVar6 = pmatch(local_838 + bVar30,pcVar13);
              pdVar11 = local_980;
              if (bVar6 == '\0') {
                if (pcVar29 == (char *)0x0) {
                  uVar18 = 0;
                }
                else {
                  bVar6 = pmatch(local_838 + bVar30,pcVar29);
                  uVar18 = CONCAT71(uVar21,bVar6 != '\0');
                  pdVar11 = local_980;
                  if (bVar6 != '\0' && cVar7 != '~') goto LAB_0020f922;
                }
              }
              else if (cVar7 != '~') {
LAB_0020f922:
                uVar20 = 0;
                pdVar11 = local_980;
                goto LAB_0020f780;
              }
            }
          }
          else {
            uVar18 = 0;
          }
          pcVar12 = dlb_fgets(local_838,0x100,pdVar11);
        } while ((pcVar12 != (char *)0x0) && (uVar26 = uVar18, local_838[0] != '.'));
      }
      uVar20 = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1);
      goto LAB_0020f780;
    }
    goto LAB_00210c92;
  }
LAB_0020f780:
  init_menulist(&local_9a0);
  uVar10 = name_to_mon(pcVar13);
  local_970 = pcVar13;
  if ((int)uVar10 < 0) goto LAB_00210be4;
  ppVar28 = mons + uVar10;
  pcVar12 = mons_mname(ppVar28);
  strcpy(local_138,pcVar12);
  lcase(local_138);
  iVar8 = strcmp(pcVar13,local_138);
  if (iVar8 != 0) goto LAB_00210be4;
  pcVar13 = mons_mname(ppVar28);
  local_970 = (char *)&local_638;
  strcpy(local_970,pcVar13);
  iVar8 = monsndx(ppVar28);
  sprintf(local_238,"Difficulty %d, AC %d, magic resistance %d.",(ulong)(uint)monstr[iVar8],
          (ulong)(uint)(int)mons[uVar10].ac);
  lVar17 = (long)local_9a0.size;
  local_950 = uVar20;
  if (local_9a0.size <= local_9a0.icount) {
    local_9a0.size = local_9a0.size * 2;
    local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
  }
  pnVar1 = local_9a0.items + local_9a0.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_9a0.icount = local_9a0.icount + 1;
  cVar7 = mons[uVar10].mmove;
  sprintf(local_948,"Speed %d (",(ulong)(uint)(int)cVar7);
  if (cVar7 < 0x24) {
    if (cVar7 < '\x14') {
      if (cVar7 < '\r') {
        if (cVar7 == '\f') {
          pcVar13 = "normal speed";
        }
        else if (cVar7 < '\t') {
          if (cVar7 < '\x03') {
            pcVar13 = "sessile";
            if ('\0' < cVar7) {
              pcVar13 = "extremely slow";
            }
          }
          else {
            pcVar13 = "very slow";
          }
        }
        else {
          pcVar13 = "slow";
        }
      }
      else {
        pcVar13 = "fast";
      }
    }
    else {
      pcVar13 = "very fast";
    }
  }
  else {
    pcVar13 = "extremely fast";
  }
  strcat(local_948,pcVar13);
  sVar14 = strlen(local_948);
  (local_948 + sVar14)[0] = ')';
  (local_948 + sVar14)[1] = '.';
  local_948[sVar14 + 2] = '\0';
  lVar17 = (long)local_9a0.size;
  if (local_9a0.size <= local_9a0.icount) {
    local_9a0.size = local_9a0.size * 2;
    local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
  }
  pnVar1 = local_9a0.items + local_9a0.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_948);
  local_9a0.icount = local_9a0.icount + 1;
  uVar2 = mons[uVar10].geno;
  uVar24 = (uint)uVar2;
  memset(local_948,0,0x100);
  bVar23 = (byte)(uVar2 >> 8);
  if ((uVar2 >> 9 & 1) == 0) {
    builtin_strncpy(local_948,"Normally",8);
    uStack_940._0_1_ = ' ';
    uStack_940._1_1_ = 'a';
    uStack_940._2_1_ = 'p';
    uStack_940._3_1_ = 'p';
    uStack_940._4_1_ = 'e';
    uStack_940._5_1_ = 'a';
    uStack_940._6_1_ = 'r';
    uStack_940._7_1_ = 's';
    local_938 = 0x20;
    bVar30 = (uVar2 & 0xc00) == 0;
    if (bVar30) {
      pcVar13 = eos(local_948);
      sprintf(pcVar13,"%s%s","","everywhere");
    }
    iVar8 = appendc(local_948,bVar23 >> 3 & 1,"outside of Gehennom",(uint)bVar30);
    iVar8 = appendc(local_948,bVar23 >> 2 & 1,"in Gehennom",iVar8);
  }
  else {
    pcVar13 = eos(local_948);
    sprintf(pcVar13,"%s%s","","Specially generated");
    iVar8 = 1;
  }
  iVar8 = appendc(local_948,bVar23 >> 4 & 1,"unique",iVar8);
  bVar23 = (byte)uVar2;
  if ((uVar2 & 0xc0) != 0) {
    if ((char)bVar23 < '\0') {
      pcVar13 = eos(local_948);
      sprintf(pcVar13,"%s%s",""," in groups");
    }
    iVar8 = appendc(local_948,bVar23 >> 6 & 1," in large groups",(uint)((char)bVar23 < '\0'));
  }
  if ((uVar2 >> 9 & 1) != 0) goto LAB_0020fc51;
  if (iVar8 != 0) {
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ',';
    (local_948 + sVar14)[1] = ' ';
    local_948[sVar14 + 2] = '\0';
  }
  switch(uVar24 & 7) {
  case 0:
    pcVar13 = eos(local_948);
    sprintf(pcVar13," frequency %d",0);
    break;
  case 1:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"very rar",8);
    *(undefined2 *)((long)&uStack_940 + sVar14) = 0x65;
    break;
  case 2:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"quite rare",0xb);
    break;
  case 3:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"rare",5);
    break;
  case 4:
    sVar14 = strlen(local_948);
    uVar18 = 0x6e6f6d6d6f636e75;
    goto LAB_0020fbe6;
  case 5:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"common",7);
    break;
  case 6:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"very com",8);
    *(undefined4 *)((long)&uStack_940 + sVar14) = 0x6e6f6d;
    break;
  case 7:
    sVar14 = strlen(local_948);
    uVar18 = 0x636966696c6f7270;
LAB_0020fbe6:
    *(undefined8 *)(local_948 + sVar14) = uVar18;
    *(undefined1 *)((long)&uStack_940 + sVar14) = 0;
  }
LAB_0020fc51:
  sVar14 = strlen(local_948);
  (local_948 + sVar14)[0] = '.';
  (local_948 + sVar14)[1] = '\0';
  add_menutext_wrapped(&local_9a0,(int)local_948,text);
  bVar6 = is_unknown_dragon(ppVar28);
  if (bVar6 == '\0') {
    builtin_strncpy(local_948,"Resists ",8);
    uStack_940 = uStack_940 & 0xffffffffffffff00;
    iVar8 = mondesc_resist_flags_to_str(local_948,mons[uVar10].mresists);
    if (iVar8 == 0) {
      lVar17 = (long)local_9a0.size;
      if (local_9a0.size <= local_9a0.icount) {
        local_9a0.size = local_9a0.size * 2;
        local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
      }
      local_9a0.items[local_9a0.icount].id = 0;
      local_9a0.items[local_9a0.icount].role = MI_TEXT;
      local_9a0.items[local_9a0.icount].accel = '\0';
      local_9a0.items[local_9a0.icount].group_accel = '\0';
      local_9a0.items[local_9a0.icount].selected = '\0';
      builtin_strncpy(local_9a0.items[local_9a0.icount].caption,"Has no resistanc",0x10);
      builtin_strncpy(local_9a0.items[local_9a0.icount].caption + 0x10,"es.",4);
      local_9a0.icount = local_9a0.icount + 1;
    }
    else {
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = '.';
      (local_948 + sVar14)[1] = '\0';
      add_menutext_wrapped(&local_9a0,(int)local_948,text_00);
    }
    if ((uVar2 & 0x10) != 0) {
      lVar17 = (long)local_9a0.size;
      if (local_9a0.size <= local_9a0.icount) {
        local_9a0.size = local_9a0.size * 2;
        local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
      }
      local_9a0.items[local_9a0.icount].id = 0;
      local_9a0.items[local_9a0.icount].role = MI_TEXT;
      local_9a0.items[local_9a0.icount].accel = '\0';
      local_9a0.items[local_9a0.icount].group_accel = '\0';
      local_9a0.items[local_9a0.icount].selected = '\0';
      builtin_strncpy(local_9a0.items[local_9a0.icount].caption,"Leaves no corpse",0x10);
      local_9a0.items[local_9a0.icount].caption[0x10] = '.';
      local_9a0.items[local_9a0.icount].caption[0x11] = '\0';
      goto LAB_0020ff5c;
    }
    builtin_strncpy(local_948,"Corpse c",8);
    uStack_940._0_1_ = 'o';
    uStack_940._1_1_ = 'n';
    uStack_940._2_1_ = 'v';
    uStack_940._3_1_ = 'e';
    uStack_940._4_1_ = 'y';
    uStack_940._5_1_ = 's';
    uStack_940._6_1_ = ' ';
    uStack_940._7_1_ = '\0';
    iVar8 = mondesc_resist_flags_to_str(local_948,mons[uVar10].mconveys);
    if (iVar8 == 0) {
      lVar17 = (long)local_9a0.size;
      if (local_9a0.size <= local_9a0.icount) {
        local_9a0.size = local_9a0.size * 2;
        local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
      }
      local_9a0.items[local_9a0.icount].id = 0;
      local_9a0.items[local_9a0.icount].role = MI_TEXT;
      local_9a0.items[local_9a0.icount].accel = '\0';
      local_9a0.items[local_9a0.icount].group_accel = '\0';
      local_9a0.items[local_9a0.icount].selected = '\0';
      builtin_strncpy(local_9a0.items[local_9a0.icount].caption,"Corpse conveys n",0x10);
      builtin_strncpy(local_9a0.items[local_9a0.icount].caption + 0xf,"no resistances.",0x10);
      goto LAB_0020ff5c;
    }
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14," resistance.",0xd);
    add_menutext_wrapped(&local_9a0,(int)local_948,text_01);
  }
  else {
    if (local_9a0.size <= local_9a0.icount) {
      lVar17 = (long)local_9a0.size;
      local_9a0.size = local_9a0.size * 2;
      local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
    }
    local_9a0.items[local_9a0.icount].id = 0;
    local_9a0.items[local_9a0.icount].role = MI_TEXT;
    local_9a0.items[local_9a0.icount].accel = '\0';
    local_9a0.items[local_9a0.icount].group_accel = '\0';
    local_9a0.items[local_9a0.icount].selected = '\0';
    builtin_strncpy(local_9a0.items[local_9a0.icount].caption,"Resistances unkn",0x10);
    builtin_strncpy(local_9a0.items[local_9a0.icount].caption + 0xd,"nknown.",8);
    local_9a0.icount = local_9a0.icount + 1;
    if (local_9a0.size <= local_9a0.icount) {
      local_9a0.size = local_9a0.size * 2;
      local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,(long)local_9a0.size * 0x10c);
    }
    local_9a0.items[local_9a0.icount].id = 0;
    local_9a0.items[local_9a0.icount].role = MI_TEXT;
    local_9a0.items[local_9a0.icount].accel = '\0';
    local_9a0.items[local_9a0.icount].group_accel = '\0';
    local_9a0.items[local_9a0.icount].selected = '\0';
    builtin_strncpy(local_9a0.items[local_9a0.icount].caption,"Corpse conveys u",0x10);
    builtin_strncpy(local_9a0.items[local_9a0.icount].caption + 0x10,"nknown resistanc",0x10);
    builtin_strncpy(local_9a0.items[local_9a0.icount].caption + 0x20,"es.",4);
LAB_0020ff5c:
    local_9a0.icount = local_9a0.icount + 1;
  }
  memset(local_948,0,0x100);
  memset(&local_738,0,0x100);
  memset(local_538,0,0x100);
  memset(local_338,0,0x100);
  memset(local_438,0,0x100);
  bVar23 = mons[uVar10].msize;
  uVar27 = (ulong)bVar23;
  uVar25 = (uint)bVar23;
  if ((uVar27 < 5) && ((0x1bU >> (uVar25 & 0x1f) & 1) != 0)) {
    pcVar13 = &DAT_002c3124 + *(int *)(&DAT_002c3124 + uVar27 * 4);
  }
  else {
    pcVar13 = "";
    if (uVar25 == 7) {
      pcVar13 = "gigantic";
    }
  }
  local_968 = ppVar28;
  strcpy((char *)&local_738,pcVar13);
  if ((char)local_738 == '\0') {
    if (uVar27 == 0) {
      local_734 = 0x6c;
      local_738 = 0x6c616d73;
    }
    else if (bVar23 < 4) {
      if (uVar25 == 3) {
        local_738 = 0x676962;
      }
    }
    else {
      local_734 = local_734 & 0xff00;
      local_738 = 0x65677568;
    }
  }
  bVar30 = (uVar2 & 0x20) == 0;
  local_954 = uVar24;
  if (bVar30) {
    pcVar13 = eos((char *)local_538);
    sprintf(pcVar13,"%s%s","","ungenocidable");
  }
  ppVar28 = local_968;
  uVar24 = local_968->mflags1;
  iVar8 = appendc((char *)local_538,(byte)(uVar24 >> 10) & 1,"breathless",(uint)bVar30);
  iVar8 = appendc((char *)local_538,(uVar24 & 0x600) != 0,"amphibious",iVar8);
  bVar16 = (byte)uVar24;
  iVar8 = appendc((char *)local_538,bVar16 >> 3 & 1,"phasing",iVar8);
  iVar8 = appendc((char *)local_538,bVar16 >> 2 & 1,"amorphous",iVar8);
  local_98c = (uint)(byte)ppVar28->mlet;
  iVar8 = appendc((char *)local_538,local_98c == 0x36,"noncorporeal",iVar8);
  iVar8 = appendc((char *)local_538,(byte)(uVar24 >> 0x14) & 1,"unsolid",iVar8);
  bVar23 = (byte)(uVar24 >> 0x18);
  iVar8 = appendc((char *)local_538,bVar23 >> 3 & 1,"acidic",iVar8);
  bVar6 = is_unknown_dragon(ppVar28);
  if (bVar6 == '\0') {
    iVar8 = appendc((char *)local_538,bVar23 >> 4 & 1,"poisonous",iVar8);
  }
  iVar8 = appendc((char *)local_538,(byte)(uVar24 >> 0x17) & 1,"regenerating",iVar8);
  iVar8 = appendc((char *)local_538,bVar23 >> 1 & 1,"teleporting",iVar8);
  uVar25 = local_98c;
  local_958 = uVar10 & 0x7ffffffd;
  bVar30 = true;
  if ((uVar10 != 0x145 && local_958 != 0x144) &&
     ((0xfffffffd < uVar10 - 0xff || ((char)local_98c != '4')))) {
    bVar30 = local_98c == 0x2e;
  }
  iVar8 = appendc((char *)local_538,bVar30,"reviving",iVar8);
  iVar8 = appendc((char *)local_538,uVar10 == 0x7b || uVar10 == 0x9e,"invisible",iVar8);
  uVar3 = ppVar28->mflags2;
  if ((uVar25 == 0x37) || ((uVar3 & 2) != 0)) {
    local_978 = appendc((char *)local_538,uVar25 == 0x37 && (uVar3 & 2) == 0,"nonliving",iVar8);
    if ((uVar3 & 2) != 0) {
      pcVar13 = eos(local_338);
      sprintf(pcVar13,"%s%s","");
    }
  }
  else {
    local_978 = appendc((char *)local_538,uVar10 == 0x33 || uVar25 == 0x16,"nonliving",iVar8);
  }
  bVar30 = (uVar24 >> 8 & 1) != 0;
  local_988 = uVar3;
  if (bVar30) {
    pcVar13 = eos(local_438);
    sprintf(pcVar13,"%s%s","","hider");
  }
  iVar8 = appendc(local_438,bVar16 >> 1 & 1,"swimmer",(uint)bVar30);
  iVar8 = appendc(local_438,bVar16 & 1,"flyer",iVar8);
  iVar8 = appendc(local_438,uVar25 == 5,"floater",iVar8);
  iVar8 = appendc(local_438,bVar16 >> 4 & 1,"clinger",iVar8);
  if ((uVar24 & 0x20) != 0) {
    pcVar13 = eos(local_438);
    pcVar12 = ", ";
    if (iVar8 == 0) {
      pcVar12 = "";
    }
    sprintf(pcVar13,"%s%s",pcVar12);
  }
  if ((char)local_738 != '\0') {
    if (local_978 < 2) {
      if ((local_438[0] == '\0' && local_338[0] == '\0') && (local_978 != 0)) {
        if (local_978 == 1) goto LAB_00210401;
        impossible("mondesc_flags(): impossible adjnum (%d)");
      }
      else {
        strcat(local_948,(char *)&local_738);
        sVar14 = strlen(local_948);
        (local_948 + sVar14)[0] = ' ';
        (local_948 + sVar14)[1] = '\0';
      }
    }
    else {
LAB_00210401:
      strcat(local_948,(char *)&local_738);
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = ',';
      (local_948 + sVar14)[1] = ' ';
      local_948[sVar14 + 2] = '\0';
    }
  }
  if (local_538[0].aatyp != '\0') {
    strcat(local_948,(char *)local_538);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_338[0] != '\0') {
    strcat(local_948,local_338);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_438[0] != '\0') {
    strcat(local_948,local_438);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_948[0] != '\0') {
    upstart(local_948);
    pcVar13 = eos(local_948);
    pcVar13[-1] = '.';
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = ' ';
    local_948[sVar14 + 2] = '\0';
  }
  bVar30 = (uVar24 >> 0x18 & 1) != 0;
  if (bVar30) {
    pcVar13 = eos(local_948);
    sprintf(pcVar13,"%s%s","","Sees invisible");
  }
  iVar8 = appendp(local_948,bVar23 >> 2 & 1,"Has teleport control",(uint)bVar30);
  iVar8 = appendp(local_948,(local_988 & (int)urace.selfmask) != 0,"Is the same race as you",iVar8);
  iVar8 = appendp(local_948,uVar10 - 0xb < 2,"Petrifies by touch",iVar8);
  iVar8 = appendp(local_948,uVar10 == 0xdb,"Disintegrates by touch",iVar8);
  uVar24 = local_988;
  if ((local_954 & 0x10) == 0) {
    if (((0x20 < local_98c) || ((0x102400404U >> ((ulong)local_98c & 0x3f) & 1) == 0)) &&
       ((uVar10 == 0x9e || ((char)local_98c != '\x1f')))) {
      if ((local_98c != 0x36) && (local_958 == 0x104 || local_98c != 0x37)) {
        if ((uVar10 != 0xd6) && ((char)local_98c == '*')) {
          iVar8 = appendp(local_948,'\x01',"May be eaten by vegetarians",iVar8);
        }
        goto LAB_00210661;
      }
    }
    pcVar13 = eos(local_948);
    pcVar12 = ".  ";
    if (iVar8 == 0) {
      pcVar12 = "";
    }
    sprintf(pcVar13,"%s%s",pcVar12,"May be eaten by vegans");
    iVar8 = iVar8 + 1;
  }
LAB_00210661:
  local_980 = pdVar11;
  pcVar13 = eos(local_948);
  pcVar12 = ".  ";
  if (iVar8 == 0) {
    pcVar12 = "";
  }
  pcVar29 = "Is not a valid polymorph form";
  if ((uVar24 & 1) == 0) {
    pcVar29 = "Is a valid polymorph form";
  }
  sprintf(pcVar13,"%s%s",pcVar12,pcVar29);
  bVar6 = ignores_scary(ppVar28);
  appendp(local_948,bVar6,"Ignores Elbereth engravings and dropped scare monster scrolls",iVar8 + 1)
  ;
  if (local_948[0] != '\0') {
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = '.';
    (local_948 + sVar14)[1] = '\0';
    add_menutext_wrapped(&local_9a0,(int)local_948,text_02);
  }
  memset((void *)((long)&uStack_940 + 2),0,0xf6);
  builtin_strncpy(local_948,"Attacks:",8);
  uStack_940 = CONCAT62(uStack_940._2_6_,0x20);
  lVar17 = 0;
  do {
    (&local_738)[lVar17] = 1;
    paVar15 = getmattk(ppVar28,(int)lVar17,&local_738,local_538);
    aVar4 = *paVar15;
    _mondesc_one_attack_buf = _mondesc_one_attack_buf & 0xffffffffffffff00;
    if ((((uint)aVar4 & 0xff0000) == 0) && (aVar4.aatyp == '\0' && (uint)aVar4 < 0x1000000)) {
      ppVar28 = local_968;
      if (aVar4.adtyp != '\0') {
        _mondesc_one_attack_buf = 0x65766973736150;
LAB_002108b5:
        uVar10 = (uint)aVar4 >> 8 & 0xff;
        if (uVar10 < 0xf0) {
          pcVar13 = "";
          switch(uVar10) {
          case 0:
            break;
          case 1:
            pcVar13 = "magic missile";
            break;
          case 2:
            pcVar13 = "fire";
            break;
          case 3:
            pcVar13 = "cold";
            break;
          case 4:
            pcVar13 = "sleep";
            break;
          case 5:
            pcVar13 = "disintegration";
            break;
          case 6:
            pcVar13 = "shock";
            break;
          case 7:
            pcVar13 = "poison";
            break;
          case 8:
            pcVar13 = "acid";
            break;
          case 9:
            pcVar13 = "buzz1";
            break;
          case 10:
            pcVar13 = "buzz2";
            break;
          case 0xb:
            pcVar13 = "blind";
            break;
          case 0xc:
            pcVar13 = "stun";
            break;
          case 0xd:
            pcVar13 = "slow";
            break;
          case 0xe:
            pcVar13 = "paralysis";
            break;
          case 0xf:
            pcVar13 = "drain life";
            break;
          case 0x10:
            pcVar13 = "drain energy";
            break;
          case 0x11:
            pcVar13 = "wound legs";
            break;
          case 0x12:
            pcVar13 = "petrification";
            break;
          case 0x13:
            pcVar13 = "sticky";
            break;
          case 0x14:
            pcVar13 = "steal gold";
            break;
          case 0x15:
            pcVar13 = "steal item";
            break;
          case 0x16:
            pcVar13 = "seduce (steal items)";
            break;
          case 0x17:
            pcVar13 = "teleport";
            break;
          case 0x18:
            pcVar13 = "erosion";
            break;
          case 0x19:
            pcVar13 = "confusion";
            break;
          case 0x1a:
            pcVar13 = "digest";
            break;
          case 0x1b:
            pcVar13 = "heal";
            break;
          case 0x1c:
            pcVar13 = "drowning";
            break;
          case 0x1d:
            pcVar13 = "lycanthropy";
            break;
          case 0x1e:
            pcVar13 = "poison (dexterity)";
            break;
          case 0x1f:
            pcVar13 = "poison (constitution)";
            break;
          case 0x20:
            pcVar13 = "drain intelligence";
            break;
          case 0x21:
            pcVar13 = "disease";
            break;
          case 0x22:
            pcVar13 = "decays organic items";
            break;
          case 0x23:
            pcVar13 = "seduce";
            break;
          case 0x24:
            pcVar13 = "hallucinate";
            break;
          case 0x25:
            pcVar13 = "death";
            break;
          case 0x26:
            pcVar13 = "plus disease";
            break;
          case 0x27:
            pcVar13 = "plus hunger";
            break;
          case 0x28:
            pcVar13 = "sliming";
            break;
          case 0x29:
            pcVar13 = "disenchant";
            break;
          case 0x2a:
            pcVar13 = "corrosion";
            break;
          default:
switchD_002108dc_caseD_2b:
            impossible("mondesc_damage_type(): invalid damage type (%d)",
                       (ulong)((uint)aVar4 >> 8 & 0xff));
            pcVar13 = "???";
            break;
          case 0x32:
            pcVar13 = "beheading";
          }
        }
        else if (uVar10 < 0xf2) {
          if (uVar10 == 0xf0) {
            pcVar13 = "(clerical)";
          }
          else {
            pcVar13 = "";
            if (uVar10 != 0xf1) goto switchD_002108dc_caseD_2b;
          }
        }
        else if (uVar10 == 0xf2) {
          pcVar13 = "random";
        }
        else if (uVar10 == 0xfc) {
          pcVar13 = "artifact stealing";
        }
        else {
          if (uVar10 != 0xfd) goto switchD_002108dc_caseD_2b;
          pcVar13 = "steal intrinsic";
        }
        if (*pcVar13 != '\0') {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
          strcat(&mondesc_one_attack_buf,pcVar13);
        }
      }
    }
    else {
      uVar10 = (int)aVar4 + 2;
      if (((byte)uVar10 < 0x13) && ((0x7f3ffU >> (uVar10 & 0x1f) & 1) != 0)) {
        pcVar13 = &DAT_002c3138 + *(int *)(&DAT_002c3138 + (ulong)(uVar10 & 0xff) * 4);
      }
      else {
        impossible("mondesc_attack_type(): invalid attack type (%d)",(ulong)((uint)aVar4 & 0xff));
        pcVar13 = "???";
      }
      strcpy(&mondesc_one_attack_buf,pcVar13);
      if (((uint)aVar4 & 0xff0000) == 0) {
        if (0xffffff < (uint)aVar4) {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x312b6c6576656c28;
          *(undefined2 *)(&DAT_0035c3d8 + sVar14) = 0x29;
          goto LAB_0021085b;
        }
      }
      else {
        sVar14 = strlen(&mondesc_one_attack_buf);
        *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
        pcVar13 = eos(&mondesc_one_attack_buf);
        sprintf(pcVar13,"%d",(ulong)((uint)aVar4 >> 0x10 & 0xff));
LAB_0021085b:
        pcVar13 = eos(&mondesc_one_attack_buf);
        sprintf(pcVar13,"d%d",(ulong)((uint)aVar4 >> 0x18));
      }
      ppVar28 = local_968;
      if ((aVar4.aatyp != '\f') || (bVar6 = is_unknown_dragon(local_968), bVar6 == '\0'))
      goto LAB_002108b5;
      sVar14 = strlen(&mondesc_one_attack_buf);
      *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x6e776f6e6b6e7520;
      (&DAT_0035c3d8)[sVar14] = 0;
    }
    if (mondesc_one_attack_buf == '\0') {
      if (lVar17 == 0) {
        sVar14 = strlen(local_948);
        builtin_strncpy(local_948 + sVar14,"none",5);
      }
      break;
    }
    if (lVar17 != 0) {
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = ',';
      (local_948 + sVar14)[1] = ' ';
      local_948[sVar14 + 2] = '\0';
    }
    strcat(local_948,&mondesc_one_attack_buf);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 6);
  sVar14 = strlen(local_948);
  (local_948 + sVar14)[0] = '.';
  (local_948 + sVar14)[1] = '\0';
  add_menutext_wrapped(&local_9a0,(int)local_948,text_03);
  pdVar11 = local_980;
  uVar20 = local_950;
LAB_00210be4:
  pcVar13 = local_970;
  if ((char)uVar20 == '\0') {
    do {
      pcVar12 = dlb_fgets(local_838,0x100,pdVar11);
      if (pcVar12 == (char *)0x0) goto LAB_00210c92;
      bVar6 = digit(local_838[0]);
    } while (bVar6 == '\0');
    iVar8 = __isoc99_sscanf(local_838,"%ld,%d\n",&local_840);
    if (1 < iVar8) {
      if (((char)local_94c != '\0' || (char)local_984 != '\0') ||
         (cVar7 = yn_function("More info?","yn",'n'), cVar7 == 'y')) {
        iVar8 = dlb_fseek(pdVar11,local_840 + local_960,0);
        if (iVar8 < 0) {
          pline("? Seek error on \'data\' file!");
          goto LAB_00210ca0;
        }
        if (local_9a0.icount != 0) {
          lVar17 = (long)local_9a0.size;
          if (local_9a0.size <= local_9a0.icount) {
            local_9a0.size = local_9a0.size * 2;
            local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
          }
          lVar17 = (long)local_9a0.icount;
          local_9a0.items[lVar17].accel = '\0';
          local_9a0.items[lVar17].group_accel = '\0';
          local_9a0.items[lVar17].selected = '\0';
          local_9a0.items[lVar17].caption[0] = '\0';
          local_9a0.items[lVar17].id = 0;
          local_9a0.items[lVar17].role = MI_TEXT;
          local_9a0.icount = local_9a0.icount + 1;
        }
        if (0 < local_974) {
          iVar8 = 0;
          pcVar12 = local_838 + 1;
          do {
            pcVar29 = dlb_fgets(local_838,0x100,pdVar11);
            if (pcVar29 == (char *)0x0) goto LAB_00210c92;
            pcVar29 = strchr(local_838,10);
            if (pcVar29 != (char *)0x0) {
              *pcVar29 = '\0';
            }
            pcVar29 = strchr(pcVar12,9);
            if (pcVar29 != (char *)0x0) {
              tabexpand(pcVar12);
            }
            lVar17 = (long)local_9a0.size;
            if (local_9a0.size <= local_9a0.icount) {
              local_9a0.size = local_9a0.size * 2;
              local_9a0.items = (nh_menuitem *)realloc(local_9a0.items,lVar17 * 0x218);
            }
            pnVar1 = local_9a0.items + local_9a0.icount;
            pnVar1->id = 0;
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,pcVar12);
            local_9a0.icount = local_9a0.icount + 1;
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_974);
        }
      }
      goto LAB_00210c0a;
    }
LAB_00210c92:
    impossible("\'data\' file in wrong format");
  }
  else {
    if (((char)local_984 != '\0') && (local_9a0.icount == 0)) {
      pline("I don\'t have any information on those things.");
    }
LAB_00210c0a:
    iVar8 = local_9a0.icount;
    pnVar1 = local_9a0.items;
    if (local_9a0.icount != 0) {
      pcVar13 = upstart(pcVar13);
      display_menu(pnVar1,iVar8,pcVar13,0,(int *)0x0);
    }
  }
LAB_00210ca0:
  free(local_9a0.items);
LAB_00210caa:
  dlb_fclose(pdVar11);
  return;
}

Assistant:

static void checkfile(const char *inp, struct permonst *pm, boolean user_typed_name,
		      boolean without_asking)
{
    dlb *fp;
    char buf[BUFSZ], newstr[BUFSZ];
    char *ep, *dbase_str;
    long txt_offset;
    int chk_skip;
    boolean found_in_file = FALSE, skipping_entry = FALSE;
    int mntmp;
    char mnname[BUFSZ];
    struct menulist menu;

    fp = dlb_fopen(DATAFILE, "r");
    if (!fp) {
	pline("Cannot open data file!");
	return;
    }

    if (user_typed_name)
	pline("Looking up \"%s\"...", inp);

    /* To prevent the need for entries in data.base like *ngel to account
     * for Angel and angel, make the lookup string the same for both
     * user_typed_name and picked name.
     */
    if (pm != NULL && !user_typed_name)
	dbase_str = strcpy(newstr, mons_mname(pm));
    else dbase_str = strcpy(newstr, inp);
    lcase(dbase_str);

    if (!strncmp(dbase_str, "interior of ", 12))
	dbase_str += 12;
    if (!strncmp(dbase_str, "a ", 2))
	dbase_str += 2;
    else if (!strncmp(dbase_str, "an ", 3))
	dbase_str += 3;
    else if (!strncmp(dbase_str, "the ", 4))
	dbase_str += 4;
    if (!strncmp(dbase_str, "tame ", 5))
	dbase_str += 5;
    else if (!strncmp(dbase_str, "peaceful ", 9))
	dbase_str += 9;
    if (!strncmp(dbase_str, "invisible ", 10))
	dbase_str += 10;
    if (!strncmp(dbase_str, "statue of ", 10))
	dbase_str[6] = '\0';
    else if (!strncmp(dbase_str, "figurine of ", 12))
	dbase_str[8] = '\0';

    /* Make sure the name is non-empty. */
    if (*dbase_str) {
	/* adjust the input to remove " [seen" and "named " and convert to lower case */
	char *alt = 0;	/* alternate description */

	if ((ep = strstri(dbase_str, " [seen")) != 0 ||
	    (ep = strstri(dbase_str, " and more")) != 0)
	    *ep = '\0';

	if ((ep = strstri(dbase_str, " named ")) != 0)
	    alt = ep + 7;
	else
	    ep = strstri(dbase_str, " called ");
	if (!ep) ep = strstri(dbase_str, ", ");
	if (ep && ep > dbase_str) *ep = '\0';

	/*
	 * If the object is named, then the name is the alternate description;
	 * otherwise, the result of makesingular() applied to the name is. This
	 * isn't strictly optimal, but named objects of interest to the user
	 * will usually be found under their name, rather than under their
	 * object type, so looking for a singular form is pointless.
	 */

	if (!alt)
	    alt = makesingular(dbase_str);
	else
	    if (user_typed_name)
		lcase(alt);

	/* skip first record; read second */
	txt_offset = 0L;
	if (!dlb_fgets(buf, BUFSZ, fp) || !dlb_fgets(buf, BUFSZ, fp)) {
	    impossible("can't read 'data' file");
	    dlb_fclose(fp);
	    return;
	} else if (sscanf(buf, "%8lx\n", &txt_offset) < 1 || txt_offset <= 0)
	    goto bad_data_file;

	/* look for the appropriate entry */
	while (dlb_fgets(buf,BUFSZ,fp)) {
	    if (*buf == '.') break;  /* we passed last entry without success */

	    if (digit(*buf)) {
		/* a number indicates the end of current entry */
		skipping_entry = FALSE;
	    } else if (!skipping_entry) {
		if (!(ep = strchr(buf, '\n'))) goto bad_data_file;
		*ep = 0;
		/* if we match a key that begins with "~", skip this entry */
		chk_skip = (*buf == '~') ? 1 : 0;
		if (pmatch(&buf[chk_skip], dbase_str) ||
			(alt && pmatch(&buf[chk_skip], alt))) {
		    if (chk_skip) {
			skipping_entry = TRUE;
			continue;
		    } else {
			found_in_file = TRUE;
			break;
		    }
		}
	    }
	}
    }

    init_menulist(&menu);

    mntmp = name_to_mon(dbase_str);
    if (mntmp >= LOW_PM) {
	strcpy(mnname, mons_mname(&mons[mntmp]));
	lcase(mnname);
	if (!strcmp(dbase_str, mnname)) {
	    dbase_str = strcpy(newstr, mons_mname(&mons[mntmp]));
	    mondesc_all(&menu, &mons[mntmp]);
	}
    }

    if (found_in_file) {
	long entry_offset;
	int  entry_count;
	int  i;

	/* skip over other possible matches for the info */
	do {
	    if (!dlb_fgets(buf, BUFSZ, fp))
		goto bad_data_file;
	} while (!digit(*buf));
	
	if (sscanf(buf, "%ld,%d\n", &entry_offset, &entry_count) < 2) {
bad_data_file:	impossible("'data' file in wrong format");
		free(menu.items);
		dlb_fclose(fp);
		return;
	}

	if (user_typed_name || without_asking || yn("More info?") == 'y') {

	    if (dlb_fseek(fp, txt_offset + entry_offset, SEEK_SET) < 0) {
		pline("? Seek error on 'data' file!");
		free(menu.items);
		dlb_fclose(fp);
		return;
	    }

	    if (menu.icount)
		add_menutext(&menu, "");

	    for (i = 0; i < entry_count; i++) {
		if (!dlb_fgets(buf, BUFSZ, fp))
		    goto bad_data_file;
		if ((ep = strchr(buf, '\n')) != 0)
		    *ep = 0;
		if (strchr(buf+1, '\t') != 0)
		    tabexpand(buf+1);
		add_menutext(&menu, buf+1);
	    }
	}
    } else if (user_typed_name && !menu.icount) {
	pline("I don't have any information on those things.");
    }

    if (menu.icount)
	display_menu(menu.items, menu.icount, upstart(dbase_str), FALSE, NULL);
    free(menu.items);

    dlb_fclose(fp);
}